

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O3

void re2::RE2CapturedGroupTest(void)

{
  char *pcVar1;
  _Rb_tree_color _Var2;
  _Rb_tree_color _Var3;
  bool bVar4;
  int iVar5;
  long lVar6;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this;
  const_iterator cVar7;
  _Rb_tree_header *p_Var8;
  string args [4];
  Arg arg3;
  Arg arg2;
  Arg arg1;
  Arg arg0;
  Arg *matches [4];
  RE2 re;
  undefined1 local_368 [16];
  char *local_358 [44];
  char acStack_1f8 [8];
  char acStack_1f0 [8];
  char local_1e8 [8];
  undefined8 local_1e0;
  char local_1d8 [112];
  char *local_168;
  code *local_160;
  char *local_158;
  code *local_150;
  char *local_148;
  code *local_140;
  Arg local_138;
  Arg *local_128;
  char **local_120;
  char **local_118;
  char **local_110;
  RE2 local_108;
  
  RE2::RE2(&local_108,"directions from (?P<S>.*) to (?P<D>.*)");
  iVar5 = RE2::NumberOfCapturingGroups(&local_108);
  if (iVar5 != 2) {
    LogMessage::LogMessage
              ((LogMessage *)local_368,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x227,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_368 + 8),"Check failed: (2) == (num_groups)",0x21);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_368);
  }
  lVar6 = 0x10;
  do {
    *(char **)(local_1e8 + lVar6 + -0x10) = local_1e8 + lVar6;
    pcVar1 = local_1e8 + lVar6 + -8;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    local_1e8[lVar6] = '\0';
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0x90);
  local_138.arg_ = local_1e8;
  local_128 = &local_138;
  local_138.parser_ = RE2::Arg::parse_string;
  local_148 = local_1d8 + 0x10;
  local_120 = &local_148;
  local_140 = RE2::Arg::parse_string;
  local_158 = local_1d8 + 0x30;
  local_118 = &local_158;
  local_150 = RE2::Arg::parse_string;
  local_168 = local_1d8 + 0x50;
  local_110 = &local_168;
  local_160 = RE2::Arg::parse_string;
  local_368._0_8_ = "directions from mountain view to san jose";
  local_368._8_4_ = 0x29;
  bVar4 = RE2::FullMatchN((StringPiece *)local_368,&local_108,&local_128,iVar5);
  if (!bVar4) {
    LogMessage::LogMessage
              ((LogMessage *)local_368,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x230,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_368 + 8),
               "Check failed: RE2::FullMatchN(\"directions from mountain view to san jose\", re, matches, num_groups)"
               ,99);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_368);
  }
  this = &RE2::NamedCapturingGroups_abi_cxx11_(&local_108)->_M_t;
  local_368._0_8_ = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"S","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(this,(key_type *)local_368);
  p_Var8 = &(this->_M_impl).super__Rb_tree_header;
  if ((char **)local_368._0_8_ != local_358) {
    operator_delete((void *)local_368._0_8_);
  }
  if ((_Rb_tree_header *)cVar7._M_node == p_Var8) {
    LogMessage::LogMessage
              ((LogMessage *)local_368,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x232,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_368 + 8),
               "Check failed: named_groups.find(\"S\") != named_groups.end()",0x3a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_368);
  }
  local_368._0_8_ = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"D","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(this,(key_type *)local_368);
  if ((char **)local_368._0_8_ != local_358) {
    operator_delete((void *)local_368._0_8_);
  }
  if ((_Rb_tree_header *)cVar7._M_node == p_Var8) {
    LogMessage::LogMessage
              ((LogMessage *)local_368,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x233,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_368 + 8),
               "Check failed: named_groups.find(\"D\") != named_groups.end()",0x3a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_368);
  }
  local_368._0_8_ = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"S","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(this,(key_type *)local_368);
  _Var2 = cVar7._M_node[2]._M_color;
  if ((char **)local_368._0_8_ != local_358) {
    operator_delete((void *)local_368._0_8_);
  }
  local_368._0_8_ = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"D","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(this,(key_type *)local_368);
  _Var3 = cVar7._M_node[2]._M_color;
  if ((char **)local_368._0_8_ != local_358) {
    operator_delete((void *)local_368._0_8_);
  }
  if (_Var2 != _S_black) {
    LogMessage::LogMessage
              ((LogMessage *)local_368,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x238,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_368 + 8),"Check failed: (1) == (source_group_index)",0x29);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_368);
  }
  if (_Var3 != 2) {
    LogMessage::LogMessage
              ((LogMessage *)local_368,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x239,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_368 + 8),"Check failed: (2) == (destination_group_index)",0x2e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_368);
  }
  iVar5 = std::__cxx11::string::compare(local_1e8 + ((long)(int)_Var2 * 4 + -4) * 8);
  if (iVar5 != 0) {
    LogMessage::LogMessage
              ((LogMessage *)local_368,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x23c,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_368 + 8),
               "Check failed: (\"mountain view\") == (args[source_group_index - 1])",0x41);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_368);
  }
  iVar5 = std::__cxx11::string::compare(local_1e8 + ((long)(int)_Var3 * 4 + -4) * 8);
  if (iVar5 != 0) {
    LogMessage::LogMessage
              ((LogMessage *)local_368,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x23d,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_368 + 8),
               "Check failed: (\"san jose\") == (args[destination_group_index - 1])",0x41);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_368);
  }
  lVar6 = 0;
  do {
    if (local_1d8 + lVar6 + 0x60 != *(char **)(local_1d8 + lVar6 + 0x50)) {
      operator_delete(*(char **)(local_1d8 + lVar6 + 0x50));
    }
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x80);
  RE2::~RE2(&local_108);
  return;
}

Assistant:

TEST(RE2, CapturedGroupTest) {
  RE2 re("directions from (?P<S>.*) to (?P<D>.*)");
  int num_groups = re.NumberOfCapturingGroups();
  EXPECT_EQ(2, num_groups);
  string args[4];
  RE2::Arg arg0(&args[0]);
  RE2::Arg arg1(&args[1]);
  RE2::Arg arg2(&args[2]);
  RE2::Arg arg3(&args[3]);

  const RE2::Arg* const matches[4] = {&arg0, &arg1, &arg2, &arg3};
  EXPECT_TRUE(RE2::FullMatchN("directions from mountain view to san jose",
                              re, matches, num_groups));
  const map<string, int>& named_groups = re.NamedCapturingGroups();
  EXPECT_TRUE(named_groups.find("S") != named_groups.end());
  EXPECT_TRUE(named_groups.find("D") != named_groups.end());

  // The named group index is 1-based.
  int source_group_index = named_groups.find("S")->second;
  int destination_group_index = named_groups.find("D")->second;
  EXPECT_EQ(1, source_group_index);
  EXPECT_EQ(2, destination_group_index);

  // The args is zero-based.
  EXPECT_EQ("mountain view", args[source_group_index - 1]);
  EXPECT_EQ("san jose", args[destination_group_index - 1]);
}